

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_new.c
# Opt level: O0

mpt_node * mpt_node_new(size_t len)

{
  mpt_node *pmVar1;
  mpt_node *node;
  size_t size;
  size_t len_local;
  
  pmVar1 = (mpt_node *)(len + 0x28);
  node = (mpt_node *)0x40;
  if (((mpt_node *)0x40 < pmVar1) && (pmVar1 < (mpt_node *)0x101)) {
    for (; node < pmVar1; node = (mpt_node *)((long)node << 1)) {
    }
  }
  len_local = (size_t)malloc((size_t)node);
  if ((undefined8 *)len_local == (undefined8 *)0x0) {
    len_local = 0;
  }
  else {
    *(undefined8 *)len_local = 0;
    *(undefined8 *)(len_local + 0x20) = 0;
    *(undefined8 *)(len_local + 0x18) = 0;
    *(undefined8 *)(len_local + 0x10) = 0;
    *(undefined8 *)(len_local + 8) = 0;
    mpt_identifier_init((mpt_identifier *)(len_local + 0x28),(size_t)&node[-1].prev);
  }
  return (mpt_node *)len_local;
}

Assistant:

extern MPT_STRUCT(node) *mpt_node_new(size_t len)
{
	static const size_t preSize = sizeof(MPT_STRUCT(node)) - sizeof(MPT_STRUCT(identifier));
	size_t size;
	MPT_STRUCT(node) *node;
	
	len += preSize;
	size = 8 * sizeof(void *);
	
	/* match node size to identifier */
	if (len > size && len <= 0x100) {
		while (size < len) {
			size *= 2;
		}
	}
	/* use default node allocation size */
	if (!(node = malloc(size))) {
		return 0;
	}
	/* zero relation pointers */
	node->_meta = 0;
	node->next = node->prev = node->parent = node->children = 0;
	
	mpt_identifier_init(&node->ident, size - preSize);
	
	return node;
}